

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divider_tests.cpp
# Opt level: O0

void __thiscall
DividerTest_Long_DivideBy_Long_Test::~DividerTest_Long_DivideBy_Long_Test
          (DividerTest_Long_DivideBy_Long_Test *this)

{
  void *in_RDI;
  
  ~DividerTest_Long_DivideBy_Long_Test((DividerTest_Long_DivideBy_Long_Test *)0x14a888);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(DividerTest, Long_DivideBy_Long) {
  verify(3);
}